

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

void __thiscall libtorrent::aux::utp_socket_impl::send_reset(utp_socket_impl *this,uint16_t ack_nr)

{
  utp_socket_manager *this_00;
  long lVar1;
  int64_t iVar2;
  udp_send_flags_t local_75;
  basic_endpoint<boost::asio::ip::udp> local_74;
  weak_ptr<libtorrent::aux::utp_socket_interface> local_58;
  undefined1 local_48 [8];
  error_code ec;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  time_point now;
  utp_header h;
  uint16_t ack_nr_local;
  utp_socket_impl *this_local;
  
  now.__d.__r._2_1_ = 0x31;
  now.__d.__r._3_1_ = 0;
  h.wnd_size.m_storage._0_2_ = ack_nr;
  unique0x100002a7 = this;
  big_endian_int<unsigned_short>::operator=
            ((big_endian_int<unsigned_short> *)((long)&now.__d.__r + 4),this->m_send_id);
  big_endian_int<unsigned_int>::operator=((big_endian_int<unsigned_int> *)&h,this->m_reply_micro);
  big_endian_int<unsigned_int>::operator=(&h.timestamp_microseconds,0);
  lVar1 = random((aux *)0xffff);
  big_endian_int<unsigned_short>::operator=
            ((big_endian_int<unsigned_short> *)&h.timestamp_difference_microseconds,
             (unsigned_short)lVar1);
  big_endian_int<unsigned_short>::operator=
            ((big_endian_int<unsigned_short> *)(h.timestamp_difference_microseconds.m_storage + 2),
             h.wnd_size.m_storage._0_2_);
  local_30.__d.__r = (duration)::std::chrono::_V2::system_clock::now();
  ec.cat_ = (error_category *)
            ::std::chrono::
            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ::time_since_epoch(&local_30);
  iVar2 = total_microseconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    ((duration<long,_std::ratio<1L,_1000000000L>_>)ec.cat_);
  big_endian_int<unsigned_int>::operator=
            ((big_endian_int<unsigned_int> *)((long)&now.__d.__r + 6),(uint)iVar2);
  boost::system::error_code::error_code((error_code *)local_48);
  this_00 = this->m_sm;
  ::std::weak_ptr<libtorrent::aux::utp_socket_interface>::weak_ptr(&local_58,&this->m_sock);
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
            (&local_74,&this->m_remote_address,this->m_port);
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>::
  bitfield_flag(&local_75);
  utp_socket_manager::send_packet
            (this_00,&local_58,&local_74,(char *)((long)&now.__d.__r + 2),0x14,
             (error_code *)local_48,local_75);
  ::std::weak_ptr<libtorrent::aux::utp_socket_interface>::~weak_ptr(&local_58);
  boost::system::error_code::operator_cast_to_bool((error_code *)local_48);
  return;
}

Assistant:

void utp_socket_impl::send_reset(std::uint16_t const ack_nr)
{
	INVARIANT_CHECK;

	utp_header h;
	h.type_ver = (ST_RESET << 4) | 1;
	h.extension = utp_no_extension;
	h.connection_id = m_send_id;
	h.timestamp_difference_microseconds = m_reply_micro;
	h.wnd_size = 0;
	h.seq_nr = std::uint16_t(random(0xffff));
	h.ack_nr = ack_nr;
	time_point const now = clock_type::now();
	h.timestamp_microseconds = std::uint32_t(
		total_microseconds(now.time_since_epoch()) & 0xffffffff);

	UTP_LOGV("%8p: send_reset seq_nr:%d id:%d ack_nr:%d\n"
		, static_cast<void*>(this), int(h.seq_nr), int(m_send_id), int(ack_nr));

	// ignore errors here
	error_code ec;
	m_sm.send_packet(m_sock, udp::endpoint(m_remote_address, m_port)
		, reinterpret_cast<char const*>(&h), sizeof(h), ec);
	if (ec)
	{
		UTP_LOGV("%8p: socket error: %s\n"
			, static_cast<void*>(this)
			, ec.message().c_str());
	}
}